

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall cfd::core::DescriptorNode::AnalyzeAll(DescriptorNode *this,string *parent_name)

{
  pointer pDVar1;
  __type _Var2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  CfdException *pCVar6;
  size_t sVar7;
  long lVar8;
  DescriptorNode *this_00;
  uint32_t index;
  uint uVar9;
  size_type __n;
  long lVar10;
  DescriptorNode *child;
  pointer pDVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script;
  Script script_1;
  size_t written;
  size_t local_400;
  string miniscript;
  TapBranch local_a8;
  
  if (this->node_type_ == kDescriptorTypeNumber) {
    return;
  }
  if (this->node_type_ == kDescriptorTypeKey) {
    AnalyzeKey(this);
    return;
  }
  if ((this->name_)._M_string_length == 0) {
    miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
    miniscript._M_string_length._0_4_ = 0x4eb;
    miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
    logger::warn<>((CfdSourceLocation *)&miniscript,"Failed to name field empty. Analyze NG.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&miniscript,"Failed to analyze descriptor.",(allocator *)&script_1);
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  lVar8 = 0;
  do {
    lVar10 = lVar8;
    if (lVar10 == 0x1b8) {
      bVar3 = ::std::operator==(parent_name,"wsh");
      if (((!bVar3) && (bVar3 = ::std::operator==(parent_name,"sh"), !bVar3)) &&
         (bVar3 = ::std::operator==(parent_name,"tr"), !bVar3)) {
        miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
        miniscript._M_string_length._0_4_ = 0x517;
        miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
        logger::warn<>((CfdSourceLocation *)&miniscript,
                       "Failed to analyze descriptor. script\'s name not found.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&miniscript,"Failed to analyze descriptor.",(allocator *)&script_1);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      bVar3 = ::std::operator==(parent_name,"sh");
      __n = 10000;
      if (bVar3) {
        __n = 0x208;
      }
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script,
                       &this->name_,"(");
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &script_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script,
                       &this->value_);
      ::std::operator+(&miniscript,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &script_1,")");
      ::std::__cxx11::string::~string((string *)&script_1);
      ::std::__cxx11::string::~string((string *)&script);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&script,__n,
                 (allocator_type *)&script_1);
      written = 0;
      bVar3 = ::std::operator==(parent_name,"tr");
      iVar4 = wally_descriptor_parse_miniscript
                        (miniscript._M_dataplus._M_p,0,0,0,0,bVar3,
                         script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         CONCAT44(script.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  script.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._0_4_) -
                         (long)script.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,&written);
      if (iVar4 == 0) {
        this->script_type_ = kDescriptorScriptMiniscript;
        ::std::__cxx11::string::_M_assign((string *)&this->value_);
        ::std::__cxx11::string::assign((char *)this);
        this->number_ = (uint32_t)written;
        lVar8 = ::std::__cxx11::string::find((char *)&miniscript,0x2325b3);
        this->need_arg_num_ = (uint)(lVar8 != -1);
        ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::clear
                  (&this->child_node_);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        ::std::__cxx11::string::~string((string *)&miniscript);
        return;
      }
      script_1._vptr_Script = (_func_int **)0x22b4b5;
      script_1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(script_1.script_data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0x50e);
      script_1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = "AnalyzeAll";
      logger::warn<>((CfdSourceLocation *)&script_1,
                     "Failed to analyze descriptor. parse miniscript fail.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&script_1,"Failed to analyze descriptor. parse miniscript fail.",
                 (allocator *)&local_400);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&script_1);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(kDescriptorNodeScriptTable + lVar10));
    lVar8 = lVar10 + 0x28;
  } while (!_Var2);
  if ((kDescriptorNodeScriptTable[lVar10 + 0x24] == '\x01') && (this->depth_ != 0)) {
    miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
    miniscript._M_string_length._0_4_ = 0x51f;
    miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
    logger::warn<>((CfdSourceLocation *)&miniscript,
                   "Failed to analyse descriptor. The target can only exist at the top.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&miniscript,
               "Failed to analyse descriptor. The target can only exist at the top.",
               (allocator *)&script_1);
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pDVar11 = (this->child_node_).
            super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->child_node_).
           super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (kDescriptorNodeScriptTable[lVar10 + 0x25] == '\x01') {
    if (pDVar11 == pDVar1) {
      miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
      miniscript._M_string_length._0_4_ = 0x527;
      miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
      logger::warn<>((CfdSourceLocation *)&miniscript,"Failed to child node empty.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&miniscript,"Failed to child node empty.",(allocator *)&script_1);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else if (pDVar11 != pDVar1) {
    miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
    miniscript._M_string_length._0_4_ = 0x52d;
    miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
    script_1._vptr_Script = (_func_int **)(((long)pDVar1 - (long)pDVar11) / 0x168);
    logger::warn<unsigned_long>
              ((CfdSourceLocation *)&miniscript,"Failed to child node num. size={}",
               (unsigned_long *)&script_1);
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&miniscript,"Failed to child node num.",(allocator *)&script_1);
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (kDescriptorNodeScriptTable[lVar10 + 0x26] == '\x01') {
    bVar3 = ::std::operator==(&this->parent_kind_,"tr");
    if (bVar3) {
      miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
      miniscript._M_string_length._0_4_ = 0x535;
      miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
      logger::warn<>((CfdSourceLocation *)&miniscript,"Failed to multisig. taproot is unsupported.")
      ;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&miniscript,"Failed to multisig. taproot is unsupported.",
                 (allocator *)&script_1);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pDVar11 = (this->child_node_).
              super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    script_1._vptr_Script =
         (_func_int **)
         (((long)(this->child_node_).
                 super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar11) / 0x168);
    if (script_1._vptr_Script < (_func_int **)0x2) {
      miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
      miniscript._M_string_length._0_4_ = 0x53c;
      miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
      logger::warn<unsigned_long>
                ((CfdSourceLocation *)&miniscript,"Failed to multisig node low. size={}",
                 (unsigned_long *)&script_1);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&miniscript,"Failed to multisig node low.",(allocator *)&script_1);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (((ulong)pDVar11->number_ == 0) ||
       ((long)script_1._vptr_Script - 1U < (ulong)pDVar11->number_)) {
      miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
      miniscript._M_string_length._0_4_ = 0x545;
      miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
      logger::warn<unsigned_int&>
                ((CfdSourceLocation *)&miniscript,"Failed to multisig require num. num={}",
                 &pDVar11->number_);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&miniscript,"Failed to multisig require num.",(allocator *)&script_1);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    bVar3 = ::std::operator==(parent_name,"wsh");
    if ((ulong)bVar3 * 4 + 0x10 < (long)script_1._vptr_Script - 1U) {
      miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
      miniscript._M_string_length._0_4_ = 0x54f;
      miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
      script_1._vptr_Script =
           (_func_int **)
           (((long)(this->child_node_).
                   super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->child_node_).
                  super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x168 + -1);
      logger::warn<unsigned_long>
                ((CfdSourceLocation *)&miniscript,"Failed to multisig pubkey num. num={}",
                 (unsigned_long *)&script_1);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&miniscript,"Failed to multisig pubkey num.",(allocator *)&script_1);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pDVar1 = (this->child_node_).
             super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar11 = (this->child_node_).
                   super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                   ._M_impl.super__Vector_impl_data._M_start; pDVar11 != pDVar1;
        pDVar11 = pDVar11 + 1) {
      AnalyzeAll(pDVar11,&this->name_);
    }
    bVar3 = ::std::operator==(parent_name,"sh");
    if (bVar3) {
      this->script_type_ = *(DescriptorScriptType *)(kDescriptorNodeScriptTable + lVar10 + 0x20);
      GetReference((DescriptorScriptReference *)&miniscript,this,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0,(DescriptorNode *)0x0);
      Script::Script(&script_1,(Script *)&miniscript._M_string_length);
      Script::GetData((ByteData *)&script,&script_1);
      sVar7 = ByteData::GetDataSize((ByteData *)&script);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      if (sVar7 - 0x206 < 0xfffffffffffffdf7) {
        script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_descriptor.cpp";
        script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0x55f;
        script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "AnalyzeAll";
        Script::GetData((ByteData *)&written,&script_1);
        local_400 = ByteData::GetDataSize((ByteData *)&written);
        logger::warn<unsigned_long>
                  ((CfdSourceLocation *)&script,"Failed to script size over. size={}",&local_400);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&written);
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&script,"Failed to script size over.",(allocator *)&written);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&script);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      Script::~Script(&script_1);
      DescriptorScriptReference::~DescriptorScriptReference
                ((DescriptorScriptReference *)&miniscript);
      goto LAB_001b86d0;
    }
    bVar3 = ::std::operator==(parent_name,"wsh");
    if (!bVar3) goto LAB_001b86d0;
    script_1._vptr_Script = (_func_int **)0x0;
    script_1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    script_1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pDVar1 = (this->child_node_).
             super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar11 = (this->child_node_).
                   super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                   ._M_impl.super__Vector_impl_data._M_start; pDVar11 != pDVar1;
        pDVar11 = pDVar11 + 1) {
      if (pDVar11->node_type_ != kDescriptorTypeNumber) {
        ::std::__cxx11::string::string((string *)&miniscript,"0",(allocator *)&script);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&script_1,
                   &miniscript);
        ::std::__cxx11::string::~string((string *)&miniscript);
        GetPubkey((Pubkey *)&miniscript,pDVar11,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&script_1);
        bVar3 = Pubkey::IsCompress((Pubkey *)&miniscript);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&miniscript);
        if (!bVar3) {
          miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
          miniscript._M_string_length._0_4_ = 0x56e;
          miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
          logger::warn<>((CfdSourceLocation *)&miniscript,
                         "Failed to multisig uncompress pubkey. wsh is compress only.");
          pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&miniscript,
                     "Failed to multisig uncompress pubkey. wsh is compress only.",
                     (allocator *)&script);
          CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
          __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
    }
  }
  else {
    bVar3 = ::std::operator==(&this->name_,"addr");
    if (bVar3) {
      core::Address::Address((Address *)&miniscript,&this->value_,&this->addr_prefixes_);
      script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_descriptor.cpp";
      script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x578;
      script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "AnalyzeAll";
      core::Address::GetAddress_abi_cxx11_((string *)&script_1,(Address *)&miniscript);
      logger::info<std::__cxx11::string>
                ((CfdSourceLocation *)&script,"Address={}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&script_1);
      ::std::__cxx11::string::~string((string *)&script_1);
      core::Address::~Address((Address *)&miniscript);
      goto LAB_001b86d0;
    }
    bVar3 = ::std::operator==(&this->name_,"raw");
    if (bVar3) {
      Script::Script((Script *)&miniscript,&this->value_);
      script_1._vptr_Script = (_func_int **)0x22b4b5;
      script_1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(script_1.script_data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0x57b);
      script_1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = "AnalyzeAll";
      Script::GetData((ByteData *)&script,(Script *)&miniscript);
      written = ByteData::GetDataSize((ByteData *)&script);
      logger::info<unsigned_long>((CfdSourceLocation *)&script_1,"script size={}",&written);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&script.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      Script::~Script((Script *)&miniscript);
      goto LAB_001b86d0;
    }
    bVar3 = ::std::operator==(&this->name_,"tr");
    pDVar11 = (this->child_node_).
              super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(this->child_node_).
                  super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar11;
    if (!bVar3) {
      if (lVar8 != 0x168) {
        script_1._vptr_Script = (_func_int **)(lVar8 / 0x168);
        miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
        miniscript._M_string_length._0_4_ = 0x59e;
        miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
        logger::warn<unsigned_long>
                  ((CfdSourceLocation *)&miniscript,"Failed to child node num. size={}",
                   (unsigned_long *)&script_1);
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&miniscript,"Failed to child node num.",(allocator *)&script_1);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      bVar3 = ::std::operator==(&this->name_,"wsh");
      if (((bVar3) && (parent_name->_M_string_length != 0)) &&
         (bVar3 = ::std::operator!=(parent_name,"sh"), bVar3)) {
        miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
        miniscript._M_string_length._0_4_ = 0x5a4;
        miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
        logger::warn<>((CfdSourceLocation *)&miniscript,"Failed to wsh parent. only top or sh.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&miniscript,"Failed to wsh parent. only top or sh.",
                   (allocator *)&script_1);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      bVar3 = ::std::operator==(&this->name_,"wpkh");
      if (((bVar3) && (parent_name->_M_string_length != 0)) &&
         (bVar3 = ::std::operator!=(parent_name,"sh"), bVar3)) {
        miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
        miniscript._M_string_length._0_4_ = 0x5aa;
        miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
        logger::warn<>((CfdSourceLocation *)&miniscript,"Failed to wpkh parent. only top or sh.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&miniscript,"Failed to wpkh parent. only top or sh.",
                   (allocator *)&script_1);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      bVar3 = ::std::operator==(&this->name_,"wsh");
      if (((bVar3) || (bVar3 = ::std::operator==(&this->name_,"sh"), bVar3)) &&
         (pDVar11 = (this->child_node_).
                    super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         pDVar11->node_type_ != kDescriptorTypeScript)) {
        miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
        miniscript._M_string_length._0_4_ = 0x5b3;
        miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
        logger::warn<cfd::core::DescriptorNodeType&>
                  ((CfdSourceLocation *)&miniscript,
                   "Failed to check script type. child is script only. nodetype={}",
                   &pDVar11->node_type_);
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&miniscript,"Failed to check script type. child is script only.",
                   (allocator *)&script_1);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      bVar3 = ::std::operator!=(&this->name_,"wsh");
      if (((bVar3) && (bVar3 = ::std::operator!=(&this->name_,"sh"), bVar3)) &&
         (pDVar11 = (this->child_node_).
                    super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         pDVar11->node_type_ != kDescriptorTypeKey)) {
        miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
        miniscript._M_string_length._0_4_ = 0x5be;
        miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
        logger::warn<cfd::core::DescriptorNodeType&>
                  ((CfdSourceLocation *)&miniscript,
                   "Failed to check key-hash type. child is key only. nodetype={}",
                   &pDVar11->node_type_);
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&miniscript,"Failed to check key-hash type. child is key only.",
                   (allocator *)&script_1);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      bVar3 = ::std::operator==(parent_name,"tr");
      if ((bVar3) && (bVar3 = ::std::operator==(&this->name_,"pkh"), bVar3)) {
        miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
        miniscript._M_string_length._0_4_ = 0x5c5;
        miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
        logger::warn<>((CfdSourceLocation *)&miniscript,"Failed to taproot. pkh is unsupported.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&miniscript,"Failed to taproot. pkh is unsupported.",
                   (allocator *)&script_1);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::__cxx11::string::_M_assign
                ((string *)
                 &((this->child_node_).
                   super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                   ._M_impl.super__Vector_impl_data._M_start)->parent_kind_);
      AnalyzeAll((this->child_node_).
                 super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                 ._M_impl.super__Vector_impl_data._M_start,&this->name_);
      bVar3 = ::std::operator==(&this->name_,"wpkh");
      if (((bVar3) || (bVar3 = ::std::operator==(&this->name_,"wsh"), bVar3)) &&
         (bVar3 = ExistUncompressedKey(this), bVar3)) {
        miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
        miniscript._M_string_length._0_4_ = 0x5d0;
        miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
        logger::warn<>((CfdSourceLocation *)&miniscript,
                       "Failed to unsing uncompressed pubkey. witness cannot uncompressed pubkey.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&miniscript,"Failed to unsing uncompressed pubkey.",
                   (allocator *)&script_1);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      goto LAB_001b86d0;
    }
    script_1._vptr_Script = (_func_int **)(lVar8 / 0x168);
    if (1 < (long)script_1._vptr_Script - 1U) {
      miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
      miniscript._M_string_length._0_4_ = 0x57f;
      miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
      logger::warn<unsigned_long>
                ((CfdSourceLocation *)&miniscript,"Failed to taproot node num. size={}",
                 (unsigned_long *)&script_1);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+(&miniscript,"Failed to taproot node num.",
                       &((this->child_node_).
                         super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                         ._M_impl.super__Vector_impl_data._M_start)->value_);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pDVar11->node_type_ = kDescriptorTypeKey;
    ::std::__cxx11::string::assign((char *)&pDVar11->parent_kind_);
    AnalyzeAll((this->child_node_).
               super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
               ._M_impl.super__Vector_impl_data._M_start,&this->name_);
    script_1._vptr_Script = (_func_int **)0x0;
    script_1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    script_1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ::std::__cxx11::string::string((string *)&miniscript,"0",(allocator *)&script);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&script_1,
               &miniscript);
    ::std::__cxx11::string::~string((string *)&miniscript);
    GetPubkey((Pubkey *)&miniscript,
              (this->child_node_).
              super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
              ._M_impl.super__Vector_impl_data._M_start,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&script_1);
    bVar3 = Pubkey::IsCompress((Pubkey *)&miniscript);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&miniscript);
    if (!bVar3) {
      miniscript._M_dataplus._M_p = "cfdcore_descriptor.cpp";
      miniscript._M_string_length._0_4_ = 0x58d;
      miniscript.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_ae815;
      logger::warn<>((CfdSourceLocation *)&miniscript,
                     "Failed to taproot pubkey. taproot is compress only.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&miniscript,
                 "Failed to taproot uncompress pubkey. taproot is compress only.",
                 (allocator *)&script);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&miniscript);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pDVar11 = (this->child_node_).
              super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->child_node_).
              super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar11 == 0x2d0) {
      ::std::__cxx11::string::assign((char *)&pDVar11[1].parent_kind_);
      AnalyzeScriptTree((this->child_node_).
                        super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
      uVar9 = 0;
      while( true ) {
        this_00 = (this->child_node_).
                  super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
        uVar5 = GetNeedArgumentNum(this_00);
        if (uVar5 <= uVar9) break;
        ::std::__cxx11::string::string((string *)&miniscript,"0",(allocator *)&script);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&script_1,
                   &miniscript);
        ::std::__cxx11::string::~string((string *)&miniscript);
        uVar9 = uVar9 + 1;
      }
      GetTapBranch(&local_a8,this_00,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&script_1);
      TapBranch::~TapBranch(&local_a8);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&script_1);
LAB_001b86d0:
  this->script_type_ = *(DescriptorScriptType *)(kDescriptorNodeScriptTable + lVar10 + 0x20);
  return;
}

Assistant:

void DescriptorNode::AnalyzeAll(const std::string& parent_name) {
  if (node_type_ == DescriptorNodeType::kDescriptorTypeNumber) {
    return;
  }
  if (node_type_ == DescriptorNodeType::kDescriptorTypeKey) {
    AnalyzeKey();
    return;
  }
  if (name_.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to name field empty. Analyze NG.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to analyze descriptor.");
  }

  const DescriptorNodeScriptData* p_data = nullptr;
  for (const auto& node_data : kDescriptorNodeScriptTable) {
    if (name_ == node_data.name) {
      p_data = &node_data;
      break;
    }
  }
  if (p_data == nullptr) {
    if ((parent_name == "wsh") || (parent_name == "sh") ||
        (parent_name == "tr")) {
      size_t max_size = (parent_name == "sh") ? Script::kMaxRedeemScriptSize
                                              : Script::kMaxScriptSize;
      std::string miniscript = name_ + "(" + value_ + ")";
      std::vector<unsigned char> script(max_size);
      size_t written = 0;
      uint32_t flags = WALLY_MINISCRIPT_WITNESS_SCRIPT;
      if (parent_name == "tr") flags = WALLY_MINISCRIPT_TAPSCRIPT;
      int ret = wally_descriptor_parse_miniscript(
          miniscript.c_str(), nullptr, nullptr, 0, 0, flags, script.data(),
          script.size(), &written);
      if (ret == WALLY_OK) {
        script_type_ = DescriptorScriptType::kDescriptorScriptMiniscript;
        value_ = miniscript;
        name_ = "miniscript";
        number_ = static_cast<uint32_t>(written);
        need_arg_num_ = (miniscript.find("*") != std::string::npos) ? 1 : 0;
        child_node_.clear();
        return;
      } else {
        warn(
            CFD_LOG_SOURCE,
            "Failed to analyze descriptor. parse miniscript fail.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to analyze descriptor. parse miniscript fail.");
      }
    }

    warn(
        CFD_LOG_SOURCE,
        "Failed to analyze descriptor. script's name not found.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to analyze descriptor.");
  }

  if (p_data->top_only && (depth_ != 0)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to analyse descriptor. The target can only exist at the top.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to analyse descriptor. The target can only exist at the top.");
  }
  if (p_data->has_child) {
    if (child_node_.empty()) {
      warn(CFD_LOG_SOURCE, "Failed to child node empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Failed to child node empty.");
    }
  } else if (!child_node_.empty()) {
    warn(
        CFD_LOG_SOURCE, "Failed to child node num. size={}",
        child_node_.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to child node num.");
  }

  if (p_data->multisig) {
    if (parent_kind_ == "tr") {
      warn(CFD_LOG_SOURCE, "Failed to multisig. taproot is unsupported.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to multisig. taproot is unsupported.");
    }
    if (child_node_.size() < 2) {
      warn(
          CFD_LOG_SOURCE, "Failed to multisig node low. size={}",
          child_node_.size());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Failed to multisig node low.");
    }
    size_t pubkey_num = child_node_.size() - 1;
    if ((child_node_[0].number_ == 0) ||
        (pubkey_num < static_cast<size_t>(child_node_[0].number_))) {
      warn(
          CFD_LOG_SOURCE, "Failed to multisig require num. num={}",
          child_node_[0].number_);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to multisig require num.");
    }
    size_t max_pubkey_num =
        (parent_name == "wsh") ? Script::kMaxMultisigPubkeyNum : 16;
    if (pubkey_num > max_pubkey_num) {
      warn(
          CFD_LOG_SOURCE, "Failed to multisig pubkey num. num={}",
          child_node_.size() - 1);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to multisig pubkey num.");
    }
    for (auto& child : child_node_) {
      child.AnalyzeAll(name_);
    }
    if (parent_name == "sh") {
      script_type_ = p_data->type;
      DescriptorScriptReference ref = GetReference(nullptr);
      Script script = ref.GetLockingScript();
      if ((script.GetData().GetDataSize() + 3) >
          Script::kMaxRedeemScriptSize) {
        warn(
            CFD_LOG_SOURCE, "Failed to script size over. size={}",
            script.GetData().GetDataSize());
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Failed to script size over.");
      }
    } else if (parent_name == "wsh") {
      // check compress pubkey
      std::vector<std::string> temp_args;
      for (auto& child : child_node_) {
        if (child.node_type_ == DescriptorNodeType::kDescriptorTypeNumber) {
          continue;
        }
        temp_args.push_back("0");
        if (!child.GetPubkey(&temp_args).IsCompress()) {
          warn(
              CFD_LOG_SOURCE,
              "Failed to multisig uncompress pubkey. wsh is compress only.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError,
              "Failed to multisig uncompress pubkey. wsh is compress only.");
        }
      }
    }
  } else if (name_ == "addr") {
    Address addr(value_, addr_prefixes_);
    info(CFD_LOG_SOURCE, "Address={}", addr.GetAddress());
  } else if (name_ == "raw") {
    Script script(value_);
    info(CFD_LOG_SOURCE, "script size={}", script.GetData().GetDataSize());
  } else if (name_ == "tr") {
    if ((child_node_.size() != 1) && (child_node_.size() != 2)) {
      warn(
          CFD_LOG_SOURCE, "Failed to taproot node num. size={}",
          child_node_.size());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot node num." + child_node_[0].value_);
    }
    child_node_[0].node_type_ = DescriptorNodeType::kDescriptorTypeKey;
    child_node_[0].parent_kind_ = "tr";
    child_node_[0].AnalyzeAll(name_);

    std::vector<std::string> temp_args;
    temp_args.push_back("0");
    if (!child_node_[0].GetPubkey(&temp_args).IsCompress()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to taproot pubkey. taproot is compress only.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot uncompress pubkey. taproot is compress only.");
    }
    if (child_node_.size() == 2) {
      child_node_[1].parent_kind_ = "tr";
      child_node_[1].AnalyzeScriptTree();
      for (uint32_t index = 0; index < child_node_[1].GetNeedArgumentNum();
           ++index) {
        temp_args.push_back("0");
      }
      child_node_[1].GetTapBranch(&temp_args);  // check
    }
  } else if (child_node_.size() != 1) {
    warn(
        CFD_LOG_SOURCE, "Failed to child node num. size={}",
        child_node_.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to child node num.");
  } else {
    if ((name_ == "wsh") && (!parent_name.empty()) && (parent_name != "sh")) {
      warn(CFD_LOG_SOURCE, "Failed to wsh parent. only top or sh.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to wsh parent. only top or sh.");
    } else if (
        (name_ == "wpkh") && (!parent_name.empty()) && (parent_name != "sh")) {
      warn(CFD_LOG_SOURCE, "Failed to wpkh parent. only top or sh.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to wpkh parent. only top or sh.");
    } else if (
        ((name_ == "wsh") || (name_ == "sh")) &&
        (child_node_[0].node_type_ !=
         DescriptorNodeType::kDescriptorTypeScript)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to check script type. child is script only. nodetype={}",
          child_node_[0].node_type_);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to check script type. child is script only.");
    } else if (
        (name_ != "wsh") && (name_ != "sh") &&
        (child_node_[0].node_type_ !=
         DescriptorNodeType::kDescriptorTypeKey)) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to check key-hash type. child is key only. nodetype={}",
          child_node_[0].node_type_);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to check key-hash type. child is key only.");
    } else if ((parent_name == "tr") && (name_ == "pkh")) {
      warn(CFD_LOG_SOURCE, "Failed to taproot. pkh is unsupported.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to taproot. pkh is unsupported.");
    }
    child_node_[0].parent_kind_ = parent_kind_;
    child_node_[0].AnalyzeAll(name_);

    if ((name_ == "wpkh") || (name_ == "wsh")) {
      if (ExistUncompressedKey()) {
        warn(
            CFD_LOG_SOURCE,
            "Failed to unsing uncompressed pubkey."
            " witness cannot uncompressed pubkey.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to unsing uncompressed pubkey.");
      }
    }
  }
  script_type_ = p_data->type;
}